

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_new_tensor_impl
          (ggml_context *ctx,ggml_type type,int n_dims,int64_t *ne,ggml_tensor *view_src,
          size_t view_offs)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  ggml_object *pgVar8;
  long lVar9;
  char *pcVar10;
  int i;
  int line;
  
  if (0x26 < type) {
    pcVar10 = "type >= 0 && type < GGML_TYPE_COUNT";
    line = 0x629;
    goto LAB_0012029c;
  }
  if (3 < n_dims - 1U) {
    pcVar10 = "n_dims >= 1 && n_dims <= GGML_MAX_DIMS";
    line = 0x62a;
    goto LAB_0012029c;
  }
  if (view_src == (ggml_tensor *)0x0) {
    view_src = (ggml_tensor *)0x0;
  }
  else if (view_src->view_src != (ggml_tensor *)0x0) {
    view_offs = view_offs + view_src->view_offs;
    view_src = view_src->view_src;
  }
  uVar2 = type_traits[type].blck_size;
  sVar3 = type_traits[type].type_size;
  uVar5 = (*ne * sVar3) / uVar2;
  for (uVar6 = 1; uVar6 < (uint)n_dims; uVar6 = uVar6 + 1) {
    uVar5 = uVar5 * ne[uVar6];
  }
  if ((view_src == (ggml_tensor *)0x0) || (uVar5 == 0)) {
    if (view_src != (ggml_tensor *)0x0) goto LAB_001200c0;
    uVar6 = 0;
    if (ctx->no_alloc != false) {
      uVar5 = uVar6;
    }
  }
  else {
    sVar7 = ggml_nbytes(view_src);
    if (sVar7 < uVar5 + view_offs) {
      pcVar10 = 
      "view_src == NULL || data_size == 0 || data_size + view_offs <= ggml_nbytes(view_src)";
      line = 0x637;
      goto LAB_0012029c;
    }
LAB_001200c0:
    uVar6 = (long)view_src->data + view_offs;
    if (view_src->data == (void *)0x0) {
      uVar6 = 0;
    }
    uVar5 = 0;
  }
  pgVar8 = ggml_new_object(ctx,GGML_OBJECT_TYPE_TENSOR,uVar5 + 0x150);
  if (pgVar8 != (ggml_object *)0x0) {
    pvVar4 = ctx->mem_buffer;
    sVar7 = pgVar8->offs;
    uVar1 = (long)pvVar4 + sVar7 + 0x150;
    if (uVar5 != 0) {
      uVar6 = uVar1;
    }
    *(ggml_type *)(uVar1 - 0x150) = type;
    *(undefined8 *)(uVar1 - 0x14c) = 0;
    *(undefined8 *)(uVar1 - 0x144) = 0x100000000;
    *(undefined8 *)(uVar1 - 0x13c) = 0x100000000;
    *(undefined8 *)(uVar1 - 0x134) = 0x100000000;
    *(undefined8 *)(uVar1 - 0x130) = 1;
    *(undefined8 *)(uVar1 - 0x128) = 1;
    memset((void *)((long)pvVar4 + sVar7 + 0x30),0,0xb8);
    *(ggml_tensor **)(uVar1 - 0x68) = view_src;
    *(size_t *)(uVar1 - 0x60) = view_offs;
    *(ulong *)(uVar1 - 0x58) = uVar6;
    *(undefined8 *)(uVar1 - 0x50) = 0;
    *(undefined8 *)(uVar1 - 0x48) = 0;
    *(undefined8 *)(uVar1 - 0x40) = 0;
    *(undefined8 *)(uVar1 - 0x38) = 0;
    *(undefined8 *)(uVar1 - 0x30) = 0;
    *(undefined8 *)(uVar1 - 0x28) = 0;
    *(undefined8 *)(uVar1 - 0x20) = 0;
    *(undefined8 *)(uVar1 - 0x18) = 0;
    *(undefined8 *)(uVar1 - 0x10) = 0;
    *(undefined8 *)(uVar1 - 8) = 0;
    for (uVar6 = 0; (uint)n_dims != uVar6; uVar6 = uVar6 + 1) {
      ((ggml_tensor *)((long)pvVar4 + sVar7))->ne[uVar6] = ne[uVar6];
    }
    *(size_t *)((long)pvVar4 + sVar7 + 0x30) = sVar3;
    *(size_t *)((long)pvVar4 + sVar7 + 0x38) =
         (*(long *)((long)pvVar4 + sVar7 + 0x10) / (long)uVar2) * sVar3;
    for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
      *(long *)((long)pvVar4 + lVar9 * 8 + sVar7 + 0x40) =
           *(long *)((long)pvVar4 + lVar9 * 8 + sVar7 + 0x18) *
           *(long *)((long)pvVar4 + lVar9 * 8 + sVar7 + 0x38);
    }
    ctx->n_objects = ctx->n_objects + 1;
    return (ggml_tensor *)((long)pvVar4 + sVar7);
  }
  pcVar10 = "obj_new";
  line = 0x646;
LAB_0012029c:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
             ,line,"GGML_ASSERT(%s) failed",pcVar10);
}

Assistant:

static struct ggml_tensor * ggml_new_tensor_impl(
        struct ggml_context * ctx,
        enum   ggml_type      type,
        int                   n_dims,
        const int64_t       * ne,
        struct ggml_tensor  * view_src,
        size_t                view_offs) {

    GGML_ASSERT(type >= 0 && type < GGML_TYPE_COUNT);
    GGML_ASSERT(n_dims >= 1 && n_dims <= GGML_MAX_DIMS);

    // find the base tensor and absolute offset
    if (view_src != NULL && view_src->view_src != NULL) {
        view_offs += view_src->view_offs;
        view_src   = view_src->view_src;
    }

    size_t data_size = ggml_row_size(type, ne[0]);
    for (int i = 1; i < n_dims; i++) {
        data_size *= ne[i];
    }

    GGML_ASSERT(view_src == NULL || data_size == 0 || data_size + view_offs <= ggml_nbytes(view_src));

    void * data = view_src != NULL ? view_src->data : NULL;
    if (data != NULL) {
        data = (char *) data + view_offs;
    }

    size_t obj_alloc_size = 0;

    if (view_src == NULL && !ctx->no_alloc) {
        // allocate tensor data in the context's memory pool
        obj_alloc_size = data_size;
    }

    struct ggml_object * const obj_new = ggml_new_object(ctx, GGML_OBJECT_TYPE_TENSOR, GGML_TENSOR_SIZE + obj_alloc_size);
    GGML_ASSERT(obj_new);

    struct ggml_tensor * const result = (struct ggml_tensor *)((char *)ctx->mem_buffer + obj_new->offs);

    *result = (struct ggml_tensor) {
        /*.type         =*/ type,
        /*.buffer       =*/ NULL,
        /*.ne           =*/ { 1, 1, 1, 1 },
        /*.nb           =*/ { 0, 0, 0, 0 },
        /*.op           =*/ GGML_OP_NONE,
        /*.op_params    =*/ { 0 },
        /*.flags        =*/ 0,
        /*.src          =*/ { NULL },
        /*.view_src     =*/ view_src,
        /*.view_offs    =*/ view_offs,
        /*.data         =*/ obj_alloc_size > 0 ? (void *)(result + 1) : data,
        /*.name         =*/ { 0 },
        /*.extra        =*/ NULL,
        /*.padding      =*/ { 0 },
    };

    // TODO: this should not be needed as long as we don't rely on aligned SIMD loads
    //GGML_ASSERT_ALIGNED(result->data);

    for (int i = 0; i < n_dims; i++) {
        result->ne[i] = ne[i];
    }

    result->nb[0] = ggml_type_size(type);
    result->nb[1] = result->nb[0]*(result->ne[0]/ggml_blck_size(type));
    for (int i = 2; i < GGML_MAX_DIMS; i++) {
        result->nb[i] = result->nb[i - 1]*result->ne[i - 1];
    }

    ctx->n_objects++;

    return result;
}